

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

void IO_ENTRYINFO(EventEnum entryid)

{
  char *frame;
  uint32 x;
  int iVar1;
  char *pcVar2;
  pthread_t x_00;
  char *str;
  void *ptr;
  int seen_before;
  int i;
  int num_new_strings;
  int frames;
  void *new_strings_ptrs [32];
  char *new_strings [32];
  void *callstack [34];
  uint32 currentms;
  EventEnum entryid_local;
  
  x = now();
  iVar1 = backtrace(new_strings + 0x1f,0x20);
  seen_before = 0;
  i = iVar1 + -2;
  if (i < 0) {
    i = 0;
  }
  for (ptr._4_4_ = 0; ptr._4_4_ < i; ptr._4_4_ = ptr._4_4_ + 1) {
    ptr._0_4_ = 0;
    frame = new_strings[(long)(ptr._4_4_ + 2) + 0x1f];
    pcVar2 = get_callstack_sym(frame,(int *)&ptr);
    if ((pcVar2 == (char *)0x0) && ((int)ptr == 0)) break;
    if ((int)ptr == 0) {
      new_strings_ptrs[(long)seen_before + 0x1f] = pcVar2;
      *(char **)(&num_new_strings + (long)seen_before * 2) = frame;
      seen_before = seen_before + 1;
    }
  }
  i = ptr._4_4_;
  if (0 < seen_before) {
    IO_EVENTENUM(ALEE_NEW_CALLSTACK_SYMS);
    IO_UINT32(seen_before);
    for (ptr._4_4_ = 0; ptr._4_4_ < seen_before; ptr._4_4_ = ptr._4_4_ + 1) {
      IO_PTR(*(void **)(&num_new_strings + (long)ptr._4_4_ * 2));
      IO_STRING((char *)new_strings_ptrs[(long)ptr._4_4_ + 0x1f]);
    }
  }
  IO_EVENTENUM(entryid);
  IO_UINT32(x);
  x_00 = pthread_self();
  IO_UINT64(x_00);
  IO_UINT32(i);
  for (ptr._4_4_ = 0; ptr._4_4_ < i; ptr._4_4_ = ptr._4_4_ + 1) {
    IO_PTR(new_strings[(long)(ptr._4_4_ + 2) + 0x1f]);
  }
  return;
}

Assistant:

__attribute__((noinline)) static void IO_ENTRYINFO(const EventEnum entryid)
{
    const uint32 currentms = now();
    void* callstack[MAX_CALLSTACKS + 2];
    char *new_strings[MAX_CALLSTACKS];
    void *new_strings_ptrs[MAX_CALLSTACKS];
    int frames = backtrace(callstack, MAX_CALLSTACKS);
    int num_new_strings = 0;
    int i;

    frames -= 2;  // skip IO_ENTRYINFO and entry point.
    if (frames < 0) {
        frames = 0;
    }

    for (i = 0; i < frames; i++) {
        int seen_before = 0;
        void *ptr = callstack[i + 2];
        char *str = get_callstack_sym(ptr, &seen_before);
        if ((str == NULL) && !seen_before) {
            break;
        }

        if (!seen_before) {
            new_strings[num_new_strings] = str;
            new_strings_ptrs[num_new_strings] = ptr;
            num_new_strings++;
        }
    }
    frames = i;  /* in case we stopped early. */

    if (num_new_strings > 0) {
        IO_EVENTENUM(ALEE_NEW_CALLSTACK_SYMS);
        IO_UINT32((uint32) num_new_strings);
        for (i = 0; i < num_new_strings; i++) {
            IO_PTR(new_strings_ptrs[i]);
            IO_STRING(new_strings[i]);
        }
    }

    IO_EVENTENUM(entryid);
    IO_UINT32(currentms);
    IO_UINT64((uint64) pthread_self());

    IO_UINT32((uint32) frames);
    for (i = 0; i < frames; i++) {
        IO_PTR(callstack[i + 2]);
    }
}